

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockCase.cpp
# Opt level: O0

void deqp::ub::anon_unknown_1::generateCompareSrc
               (ostringstream *src,char *resultVar,ShaderInterface *interface,UniformLayout *layout,
               map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
               *blockPointers,bool isVertex)

{
  void *basePtr_00;
  bool bVar1;
  uint unusedMask_00;
  int iVar2;
  deUint32 dVar3;
  UniformBlock *this;
  char *pcVar4;
  pointer ppVar5;
  VarType *type;
  char *pcVar6;
  uint uVar7;
  int local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  Uniform *local_1f8;
  Uniform *uniform;
  __normal_iterator<const_deqp::ub::Uniform_*,_std::vector<deqp::ub::Uniform,_std::allocator<deqp::ub::Uniform>_>_>
  local_1e8;
  ConstIterator uniformIter;
  void *basePtr;
  byte local_1c6;
  allocator<char> local_1c5;
  int activeBlockNdx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  undefined1 local_180 [8];
  string srcPrefix;
  string blockInstanceName;
  string local_138;
  byte local_113;
  byte local_112;
  allocator<char> local_111;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [8];
  string instancePostfix;
  allocator<char> local_a6;
  byte local_a5;
  int instanceNdx;
  byte local_92;
  allocator<char> local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [8];
  string apiPrefix;
  int numInstances;
  bool isArray;
  bool hasInstanceName;
  UniformBlock *block;
  int blockNdx;
  deUint32 unusedMask;
  bool isVertex_local;
  map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
  *blockPointers_local;
  UniformLayout *layout_local;
  ShaderInterface *interface_local;
  char *resultVar_local;
  ostringstream *src_local;
  
  unusedMask_00 = 0x800;
  if (isVertex) {
    unusedMask_00 = 0x400;
  }
  for (block._4_4_ = 0; iVar2 = ShaderInterface::getNumUniformBlocks(interface), block._4_4_ < iVar2
      ; block._4_4_ = block._4_4_ + 1) {
    this = ShaderInterface::getUniformBlock(interface,block._4_4_);
    dVar3 = UniformBlock::getFlags(this);
    uVar7 = 0x200;
    if (isVertex) {
      uVar7 = 0x100;
    }
    if ((dVar3 & uVar7) != 0) {
      pcVar4 = UniformBlock::getInstanceName(this);
      apiPrefix.field_2._M_local_buf[0xf] = pcVar4 != (char *)0x0;
      apiPrefix.field_2._M_local_buf[0xe] = UniformBlock::isArray(this);
      if ((bool)apiPrefix.field_2._M_local_buf[0xe]) {
        local_248 = UniformBlock::getArraySize(this);
      }
      else {
        local_248 = 1;
      }
      apiPrefix.field_2._8_4_ = local_248;
      local_92 = 0;
      local_a5 = 0;
      if ((apiPrefix.field_2._M_local_buf[0xf] & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)local_70,"",&local_a6);
        std::allocator<char>::~allocator(&local_a6);
      }
      else {
        pcVar4 = UniformBlock::getBlockName(this);
        std::allocator<char>::allocator();
        local_92 = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,pcVar4,&local_91);
        local_a5 = 1;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70
                       ,&local_90,".");
      }
      if ((local_a5 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_90);
      }
      if ((local_92 & 1) != 0) {
        std::allocator<char>::~allocator(&local_91);
      }
      for (instancePostfix.field_2._12_4_ = 0;
          (int)instancePostfix.field_2._12_4_ < (int)apiPrefix.field_2._8_4_;
          instancePostfix.field_2._12_4_ = instancePostfix.field_2._12_4_ + 1) {
        local_112 = 0;
        local_113 = 0;
        blockInstanceName.field_2._M_local_buf[0xf] = '\0';
        blockInstanceName.field_2._M_local_buf[0xe] = '\0';
        blockInstanceName.field_2._M_local_buf[0xc] = '\0';
        if ((apiPrefix.field_2._M_local_buf[0xe] & 1U) == 0) {
          std::allocator<char>::allocator();
          blockInstanceName.field_2._M_local_buf[0xc] = '\x01';
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_d0,"",
                     (allocator<char> *)(blockInstanceName.field_2._M_local_buf + 0xd));
        }
        else {
          std::allocator<char>::allocator();
          local_112 = 1;
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"[",&local_111);
          local_113 = 1;
          de::toString<int>(&local_138,(int *)(instancePostfix.field_2._M_local_buf + 0xc));
          blockInstanceName.field_2._M_local_buf[0xf] = '\x01';
          std::operator+(&local_f0,&local_110,&local_138);
          blockInstanceName.field_2._M_local_buf[0xe] = '\x01';
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_d0,&local_f0,"]");
        }
        if ((blockInstanceName.field_2._M_local_buf[0xc] & 1U) != 0) {
          std::allocator<char>::~allocator
                    ((allocator<char> *)(blockInstanceName.field_2._M_local_buf + 0xd));
        }
        if ((blockInstanceName.field_2._M_local_buf[0xe] & 1U) != 0) {
          std::__cxx11::string::~string((string *)&local_f0);
        }
        if ((blockInstanceName.field_2._M_local_buf[0xf] & 1U) != 0) {
          std::__cxx11::string::~string((string *)&local_138);
        }
        if ((local_113 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_110);
        }
        if ((local_112 & 1) != 0) {
          std::allocator<char>::~allocator(&local_111);
        }
        pcVar4 = UniformBlock::getBlockName(this);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&srcPrefix.field_2 + 8),pcVar4,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0
                      );
        activeBlockNdx._2_1_ = 0;
        activeBlockNdx._1_1_ = 0;
        activeBlockNdx._0_1_ = 0;
        local_1c6 = 0;
        if ((apiPrefix.field_2._M_local_buf[0xf] & 1U) == 0) {
          std::allocator<char>::allocator();
          local_1c6 = 1;
          std::__cxx11::string::string<std::allocator<char>>((string *)local_180,"",&local_1c5);
        }
        else {
          pcVar4 = UniformBlock::getInstanceName(this);
          std::allocator<char>::allocator();
          activeBlockNdx._2_1_ = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1c0,pcVar4,(allocator<char> *)((long)&activeBlockNdx + 3));
          activeBlockNdx._1_1_ = 1;
          std::operator+(&local_1a0,&local_1c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_d0);
          activeBlockNdx._0_1_ = 1;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_180,&local_1a0,".");
        }
        if ((local_1c6 & 1) != 0) {
          std::allocator<char>::~allocator(&local_1c5);
        }
        if (((byte)activeBlockNdx & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_1a0);
        }
        if ((activeBlockNdx._1_1_ & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_1c0);
        }
        if ((activeBlockNdx._2_1_ & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)((long)&activeBlockNdx + 3));
        }
        pcVar4 = (char *)std::__cxx11::string::c_str();
        basePtr._4_4_ = UniformLayout::getBlockIndex(layout,pcVar4);
        uniformIter._M_current =
             (Uniform *)
             std::map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>::
             find(blockPointers,(key_type_conflict *)((long)&basePtr + 4));
        ppVar5 = std::_Rb_tree_const_iterator<std::pair<const_int,_void_*>_>::operator->
                           ((_Rb_tree_const_iterator<std::pair<const_int,_void_*>_> *)&uniformIter);
        basePtr_00 = ppVar5->second;
        local_1e8._M_current = (Uniform *)UniformBlock::begin(this);
        while( true ) {
          uniform = (Uniform *)UniformBlock::end(this);
          bVar1 = __gnu_cxx::operator!=
                            (&local_1e8,
                             (__normal_iterator<const_deqp::ub::Uniform_*,_std::vector<deqp::ub::Uniform,_std::allocator<deqp::ub::Uniform>_>_>
                              *)&uniform);
          if (!bVar1) break;
          local_1f8 = __gnu_cxx::
                      __normal_iterator<const_deqp::ub::Uniform_*,_std::vector<deqp::ub::Uniform,_std::allocator<deqp::ub::Uniform>_>_>
                      ::operator*(&local_1e8);
          dVar3 = ub::Uniform::getFlags(local_1f8);
          if ((dVar3 & unusedMask_00) == 0) {
            type = ub::Uniform::getType(local_1f8);
            pcVar4 = ub::Uniform::getName(local_1f8);
            std::operator+(&local_218,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_180,pcVar4);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            pcVar6 = ub::Uniform::getName(local_1f8);
            std::operator+(&local_238,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_70,pcVar6);
            pcVar6 = (char *)std::__cxx11::string::c_str();
            generateCompareSrc(src,resultVar,type,pcVar4,pcVar6,layout,basePtr_00,unusedMask_00);
            std::__cxx11::string::~string((string *)&local_238);
            std::__cxx11::string::~string((string *)&local_218);
          }
          __gnu_cxx::
          __normal_iterator<const_deqp::ub::Uniform_*,_std::vector<deqp::ub::Uniform,_std::allocator<deqp::ub::Uniform>_>_>
          ::operator++(&local_1e8,0);
        }
        std::__cxx11::string::~string((string *)local_180);
        std::__cxx11::string::~string((string *)(srcPrefix.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_d0);
      }
      std::__cxx11::string::~string((string *)local_70);
    }
  }
  return;
}

Assistant:

void generateCompareSrc(std::ostringstream& src, const char* resultVar, const ShaderInterface& interface,
						const UniformLayout& layout, const std::map<int, void*>& blockPointers, bool isVertex)
{
	deUint32 unusedMask = isVertex ? UNUSED_VERTEX : UNUSED_FRAGMENT;

	for (int blockNdx = 0; blockNdx < interface.getNumUniformBlocks(); blockNdx++)
	{
		const UniformBlock& block = interface.getUniformBlock(blockNdx);

		if ((block.getFlags() & (isVertex ? DECLARE_VERTEX : DECLARE_FRAGMENT)) == 0)
			continue; // Skip.

		bool		hasInstanceName = block.getInstanceName() != DE_NULL;
		bool		isArray			= block.isArray();
		int			numInstances	= isArray ? block.getArraySize() : 1;
		std::string apiPrefix		= hasInstanceName ? string(block.getBlockName()) + "." : string("");

		DE_ASSERT(!isArray || hasInstanceName);

		for (int instanceNdx = 0; instanceNdx < numInstances; instanceNdx++)
		{
			std::string instancePostfix   = isArray ? string("[") + de::toString(instanceNdx) + "]" : string("");
			std::string blockInstanceName = block.getBlockName() + instancePostfix;
			std::string srcPrefix =
				hasInstanceName ? string(block.getInstanceName()) + instancePostfix + "." : string("");
			int   activeBlockNdx = layout.getBlockIndex(blockInstanceName.c_str());
			void* basePtr		 = blockPointers.find(activeBlockNdx)->second;

			for (UniformBlock::ConstIterator uniformIter = block.begin(); uniformIter != block.end(); uniformIter++)
			{
				const Uniform& uniform = *uniformIter;

				if (uniform.getFlags() & unusedMask)
					continue; // Don't read from that uniform.

				generateCompareSrc(src, resultVar, uniform.getType(), (srcPrefix + uniform.getName()).c_str(),
								   (apiPrefix + uniform.getName()).c_str(), layout, basePtr, unusedMask);
			}
		}
	}
}